

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O3

void __thiscall Wasm::WasmBinaryReader::ShuffleNode(WasmBinaryReader *this)

{
  uint32 *puVar1;
  uchar uVar2;
  long lVar3;
  
  if (0xf < (uint)(*(int *)&this->m_end - *(int *)&this->m_pc)) {
    lVar3 = 0x10;
    do {
      uVar2 = ReadConst<unsigned_char>(this);
      *(uchar *)((long)&(this->super_WasmReaderBase)._vptr_WasmReaderBase + lVar3) = uVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x20);
    puVar1 = &(this->m_funcState).count;
    *puVar1 = *puVar1 + 0x10;
    return;
  }
  ThrowDecodingError(this,L"Out of file: Needed: %d, Left: %d",0x10);
}

Assistant:

void WasmBinaryReader::ShuffleNode()
{
    CheckBytesLeft(Simd::MAX_LANES);
    for (uint32 i = 0; i < Simd::MAX_LANES; i++)
    {
        m_currentNode.shuffle.indices[i] = ReadConst<uint8>();
    }
    m_funcState.count += Simd::MAX_LANES;
}